

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_alert_list_db_metric.cc
# Opt level: O3

int __thiscall
aliyun::Alert::ListDBMetric
          (Alert *this,AlertListDBMetricRequestType *req,AlertListDBMetricResponseType *response,
          AlertErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  AliRoaRequest *this_00;
  size_t sVar7;
  Value *pVVar8;
  ulong *puVar9;
  char *pcVar10;
  undefined8 uVar11;
  Value val;
  string url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string secheme;
  string str_response;
  Reader reader;
  string local_3a0;
  AlertListDBMetricResponseType *local_380;
  Value local_378;
  long *local_360;
  long local_358;
  long local_350;
  undefined8 uStack_348;
  string local_340;
  long *local_320 [2];
  long local_310 [2];
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_380 = response;
  Json::Value::Value(&local_378,nullValue);
  Json::Reader::Reader(&local_140);
  pcVar10 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar10 = "https";
  }
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,pcVar10,pcVar10 + (ulong)this->use_tls_ + 4);
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_320,local_300,local_2f8 + (long)local_300);
  std::__cxx11::string::append((char *)local_320);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_320);
  paVar1 = &local_3a0.field_2;
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_3a0.field_2._M_allocated_capacity = *puVar9;
    local_3a0.field_2._8_4_ = (undefined4)plVar5[3];
    local_3a0.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_3a0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_3a0.field_2._M_allocated_capacity = *puVar9;
    local_3a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3a0._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  get_format_string_abi_cxx11_
            (&local_340,"/projects/%s/dbMetrics",(req->project_name)._M_dataplus._M_p);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar1) {
    uVar11 = local_3a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_340._M_string_length + local_3a0._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      uVar11 = local_340.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_340._M_string_length + local_3a0._M_string_length) goto LAB_001402a0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_340,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
  }
  else {
LAB_001402a0:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_340._M_dataplus._M_p);
  }
  local_360 = &local_350;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_350 = *plVar5;
    uStack_348 = puVar6[3];
  }
  else {
    local_350 = *plVar5;
    local_360 = (long *)*puVar6;
  }
  local_358 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  this_00 = (AliRoaRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_320);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_340);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_360,(undefined1 *)(local_358 + (long)local_360));
  AliRoaRequest::AliRoaRequest(this_00,&local_160,&local_180,&local_1a0,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar10 = this->proxy_host_, pcVar10 != (char *)0x0)) &&
     (*pcVar10 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar7 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar10,pcVar10 + sVar7);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"GET","");
  AliHttpRequest::setRequestMethod((AliHttpRequest *)this_00,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->metric_name)._M_string_length != 0) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"MetricName","");
    pcVar2 = (req->metric_name)._M_dataplus._M_p;
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar2,pcVar2 + (req->metric_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page)._M_string_length != 0) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Page","");
    pcVar2 = (req->page)._M_dataplus._M_p;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,pcVar2,pcVar2 + (req->page)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_2e0);
    if ((0 < iVar4) && (local_2e0._M_string_length != 0)) {
      bVar3 = Json::Reader::parse(&local_140,&local_2e0,&local_378,true);
      if (bVar3) {
        if (error_info != (AlertErrorInfo *)0x0 && iVar4 != 200) {
          bVar3 = Json::Value::isMember(&local_378,"RequestId");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
          }
          else {
            local_3a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a0,anon_var_dwarf_27068e + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_3a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_378,"Code");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"Code");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
          }
          else {
            local_3a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a0,anon_var_dwarf_27068e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_3a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_378,"HostId");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"HostId");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
          }
          else {
            local_3a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a0,anon_var_dwarf_27068e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_3a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Json::Value::isMember(&local_378,"Message");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"Message");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
          }
          else {
            local_3a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a0,anon_var_dwarf_27068e + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_3a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_380 != (AlertListDBMetricResponseType *)0x0 && iVar4 == 200) {
          bVar3 = Json::Value::isMember(&local_378,"code");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"code");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)local_380,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(&local_378,"message");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"message");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)&local_380->message,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(&local_378,"success");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"success");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)&local_380->success,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(&local_378,"traceId");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"traceId");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)&local_380->trace_id,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(&local_378,"datapoints");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"datapoints");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)&local_380->datapoints,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(&local_378,"total");
          iVar4 = 200;
          if (bVar3) {
            pVVar8 = Json::Value::operator[](&local_378,"total");
            Json::Value::asString_abi_cxx11_(&local_3a0,pVVar8);
            std::__cxx11::string::operator=((string *)&local_380->total,(string *)&local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        goto LAB_0014082b;
      }
    }
    if (error_info == (AlertErrorInfo *)0x0) goto LAB_00140826;
    pcVar10 = "parse response failed";
  }
  else {
    if (error_info == (AlertErrorInfo *)0x0) {
LAB_00140826:
      iVar4 = -1;
      goto LAB_0014082b;
    }
    pcVar10 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar10);
LAB_0014082b:
  AliRoaRequest::~AliRoaRequest(this_00);
  operator_delete(this_00,0x2c8);
  if (local_360 != &local_350) {
    operator_delete(local_360,local_350 + 1);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                             local_2e0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Alert::ListDBMetric(const AlertListDBMetricRequestType& req,
                      AlertListDBMetricResponseType* response,
                      AlertErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/projects/%s/dbMetrics", req.project_name.c_str());
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("GET");
  if(!req.metric_name.empty()) {
    req_rpc->AddRequestQuery("MetricName", req.metric_name);
  }
  if(!req.page.empty()) {
    req_rpc->AddRequestQuery("Page", req.page);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}